

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O2

CURLcode resolver_error(connectdata *conn)

{
  _Bool _Var1;
  char *pcVar2;
  
  _Var1 = (conn->bits).httpproxy;
  pcVar2 = "host";
  if (_Var1 != false) {
    pcVar2 = "proxy";
  }
  Curl_failf(conn->data,"Could not resolve %s: %s",pcVar2,(conn->async).hostname);
  return CURLE_COULDNT_RESOLVE_HOST - _Var1;
}

Assistant:

static CURLcode resolver_error(struct connectdata *conn)
{
  const char *host_or_proxy;
  CURLcode result;

  if(conn->bits.httpproxy) {
    host_or_proxy = "proxy";
    result = CURLE_COULDNT_RESOLVE_PROXY;
  }
  else {
    host_or_proxy = "host";
    result = CURLE_COULDNT_RESOLVE_HOST;
  }

  failf(conn->data, "Could not resolve %s: %s", host_or_proxy,
        conn->async.hostname);

  return result;
}